

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
::fastAccessDx(FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
               *this,int i)

{
  FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  *in_RDI;
  value_type vVar1;
  value_type vVar2;
  int in_stack_ffffffffffffffdc;
  
  vVar1 = FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
          ::fastAccessDx(in_RDI,in_stack_ffffffffffffffdc);
  vVar2 = FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
          ::fastAccessDx((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
                          *)in_RDI,in_stack_ffffffffffffffdc);
  return vVar1 + vVar2;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i)+right_.fastAccessDx(i);}